

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonReporter::JsonReporter(JsonReporter *this,ReporterConfig *config)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type extraout_RDX;
  int iVar1;
  _Elt_pointer pJVar2;
  StringRef value;
  JsonObjectWriter metadata_writer;
  uint local_1dc;
  JsonObjectWriter local_1d8;
  undefined1 local_1c0 [400];
  uint64_t local_30;
  
  ReporterBase::ReporterBase((ReporterBase *)this,config);
  (this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       "test run has not started yet";
  (this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = 0x1c;
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__JsonReporter_001afb48;
  (this->m_testCaseTimer).m_nanoseconds = 0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_objectWriters).c.
  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::
  _M_initialize_map((_Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                     *)&this->m_objectWriters,0);
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_arrayWriters).c.
  super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::
  _M_initialize_map((_Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_> *)
                    &this->m_arrayWriters,0);
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_writers).c.
  super__Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  _M_initialize_map((_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>
                     *)&this->m_writers,0);
  this->m_startedListing = false;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldRedirectStdOut = true;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldReportAllAssertions = true;
  std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>::
  emplace_back<std::ostream&>
            ((deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>> *)
             &this->m_objectWriters,(this->super_StreamingReporterBase).super_ReporterBase.m_stream)
  ;
  local_1c0._0_4_ = Object;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)local_1c0);
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  iVar1 = (int)pJVar2 + -0x18;
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,iVar1,"version",7);
  local_1d8.m_os = (ostream *)CONCAT44(local_1d8.m_os._4_4_,1);
  JsonValueWriter::writeImpl<int,void>((JsonValueWriter *)local_1c0,(int *)&local_1d8,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,iVar1,"metadata",8);
  local_1d8.m_os = (ostream *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_);
  local_1d8.m_indent_level = local_30;
  local_1d8.m_should_comma = false;
  local_1d8.m_active = true;
  local_1dc = CONCAT31(local_1dc._1_3_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>(local_1d8.m_os,(char *)&local_1dc,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1d8,"name",4);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[3])();
  value.m_start._4_4_ = extraout_var;
  value.m_start._0_4_ = iVar1;
  value.m_size = extraout_RDX;
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1c0,value,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1d8,"rng-seed",8);
  local_1dc = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.
                m_config)->_vptr_IConfig[0x11])();
  JsonValueWriter::writeImpl<unsigned_int,void>((JsonValueWriter *)local_1c0,&local_1dc,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1d8,"catch2-version",0xe);
  libraryVersion();
  JsonValueWriter::writeImpl<Catch::Version,void>
            ((JsonValueWriter *)local_1c0,&libraryVersion::version,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var_00,iVar1) != ((long *)CONCAT44(extraout_var_00,iVar1))[1]) {
    JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1d8,"filters",7);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    JsonValueWriter::writeImpl<Catch::TestSpec,void>
              ((JsonValueWriter *)local_1c0,(TestSpec *)CONCAT44(extraout_var_01,iVar1),true);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  }
  JsonObjectWriter::~JsonObjectWriter(&local_1d8);
  return;
}

Assistant:

JsonReporter::JsonReporter( ReporterConfig&& config ):
        StreamingReporterBase{ CATCH_MOVE( config ) } {

        m_preferences.shouldRedirectStdOut = true;
        // TBD: Do we want to report all assertions? XML reporter does
        //      not, but for machine-parseable reporters I think the answer
        //      should be yes.
        m_preferences.shouldReportAllAssertions = true;

        m_objectWriters.emplace( m_stream );
        m_writers.emplace( Writer::Object );
        auto& writer = m_objectWriters.top();

        writer.write( "version"_sr ).write( 1 );

        {
            auto metadata_writer = writer.write( "metadata"_sr ).writeObject();
            metadata_writer.write( "name"_sr ).write( m_config->name() );
            metadata_writer.write( "rng-seed"_sr ).write( m_config->rngSeed() );
            metadata_writer.write( "catch2-version"_sr )
                .write( libraryVersion() );
            if ( m_config->testSpec().hasFilters() ) {
                metadata_writer.write( "filters"_sr )
                    .write( m_config->testSpec() );
            }
        }
    }